

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  string *psVar6;
  char cVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 local_40 [16];
  undefined4 extraout_var_00;
  
  do {
    iVar1 = this->stream_count_;
    if (iVar1 < 1) break;
    iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar4 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,(ulong)(uint)count);
    if ((char)iVar4 == '\0') {
      lVar9 = CONCAT44(extraout_var,iVar3) + (long)count;
      iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      lVar5 = CONCAT44(extraout_var_00,iVar3);
      if (lVar5 < lVar9) {
        psVar6 = (string *)0x0;
      }
      else {
        psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar5,lVar9,"final_byte_count < target_byte_count");
      }
      if (psVar6 != (string *)0x0) {
        puVar8 = local_40;
        Skip();
        cVar7 = (char)*(undefined8 *)(puVar8 + 0x18);
        if (*(int *)(puVar8 + 0x10) != 0) {
          cVar2 = (**(code **)(*(long *)**(undefined8 **)(puVar8 + 8) + 0x28))();
          cVar7 = cVar7 + cVar2;
        }
        return (bool)cVar7;
      }
      this->bytes_retired_ = this->bytes_retired_ + lVar5;
      count = (int)lVar9 - iVar3;
      this->streams_ = this->streams_ + 1;
      this->stream_count_ = this->stream_count_ + -1;
    }
  } while ((char)iVar4 == '\0');
  return 0 < iVar1;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}